

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.hpp
# Opt level: O3

void write<glm::vec<4,float,(glm::qualifier)0>>
               (vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                *v,ostream *stream)

{
  uint64_t size;
  uint64_t local_20;
  
  std::ostream::write((char *)stream,0x1732fa);
  local_20 = (long)(v->
                   super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(v->
                   super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4;
  swapEndianness(&local_20);
  std::ostream::write((char *)stream,(long)&local_20);
  std::ostream::write((char *)stream,
                      (long)(v->
                            super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void write(const std::vector<T> & v, std::ostream & stream)
{
  static_assert(SerializationTraits<T>::IsSerializable, "write(): Vector element type is not serializable");

  // Write TAG(4B), SIZE(8B), VALUES...
  stream.write(SerializationTraits<T>::VectorTag(), 4);
  std::uint64_t size = v.size();
  swapEndianness(size);
  stream.write(reinterpret_cast<char *>(&size), sizeof(size));

  if (SerializationTraits<T>::IsEndiannessDependent) {
#ifdef IS_BIG_ENDIAN
    std::vector<T> duplicate = v;
    for (T & value : duplicate) {
      swapEndianness(value);
    }
    stream.write(duplicate.data(), duplicate.size() * sizeof(T));
#else
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
#endif
  } else {
    stream.write(reinterpret_cast<const char *>(v.data()), v.size() * sizeof(T));
  }
}